

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packer.cpp
# Opt level: O0

void __thiscall CPacker::AddString(CPacker *this,char *pStr,int Limit)

{
  uchar uVar1;
  uchar *puVar2;
  int Limit_local;
  char *pStr_local;
  CPacker *this_local;
  
  if (this->m_Error == 0) {
    Limit_local = Limit;
    pStr_local = pStr;
    if (Limit < 1) {
      do {
        if (*pStr_local == '\0') goto LAB_0015ae3a;
        uVar1 = *pStr_local;
        puVar2 = this->m_pCurrent;
        this->m_pCurrent = puVar2 + 1;
        *puVar2 = uVar1;
        pStr_local = pStr_local + 1;
      } while (this->m_pCurrent < this->m_pEnd);
      this->m_Error = 1;
LAB_0015ae3a:
      puVar2 = this->m_pCurrent;
      this->m_pCurrent = puVar2 + 1;
      *puVar2 = '\0';
    }
    else {
      do {
        if (*pStr_local == '\0' || Limit_local == 0) goto LAB_0015adbd;
        uVar1 = *pStr_local;
        puVar2 = this->m_pCurrent;
        this->m_pCurrent = puVar2 + 1;
        *puVar2 = uVar1;
        Limit_local = Limit_local + -1;
        pStr_local = pStr_local + 1;
      } while (this->m_pCurrent < this->m_pEnd);
      this->m_Error = 1;
LAB_0015adbd:
      puVar2 = this->m_pCurrent;
      this->m_pCurrent = puVar2 + 1;
      *puVar2 = '\0';
    }
  }
  return;
}

Assistant:

void CPacker::AddString(const char *pStr, int Limit)
{
	if(m_Error)
		return;

	//
	if(Limit > 0)
	{
		while(*pStr && Limit != 0)
		{
			*m_pCurrent++ = *pStr++;
			Limit--;

			if(m_pCurrent >= m_pEnd)
			{
				m_Error = 1;
				break;
			}
		}
		*m_pCurrent++ = 0;
	}
	else
	{
		while(*pStr)
		{
			*m_pCurrent++ = *pStr++;

			if(m_pCurrent >= m_pEnd)
			{
				m_Error = 1;
				break;
			}
		}
		*m_pCurrent++ = 0;
	}
}